

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlNodePtr
xmlCtxtParseContentInternal
          (xmlParserCtxtPtr ctxt,xmlParserInputPtr input,int hasTextDecl,int buildTree)

{
  int iVar1;
  _xmlNode *local_48;
  xmlNodePtr cur;
  int result;
  xmlChar *rootName;
  xmlNodePtr list;
  xmlNodePtr root;
  int buildTree_local;
  int hasTextDecl_local;
  xmlParserInputPtr input_local;
  xmlParserCtxtPtr ctxt_local;
  
  list = (xmlNodePtr)0x0;
  rootName = (xmlChar *)0x0;
  if ((buildTree == 0) ||
     (list = xmlNewDocNode(ctxt->myDoc,(xmlNsPtr)0x0,(xmlChar *)"#root",(xmlChar *)0x0),
     list != (xmlNodePtr)0x0)) {
    iVar1 = xmlCtxtPushInput(ctxt,input);
    if (-1 < iVar1) {
      nameNsPush(ctxt,(xmlChar *)"#root",(xmlChar *)0x0,(xmlChar *)0x0,0,0);
      spacePush(ctxt,-1);
      if (buildTree != 0) {
        nodePush(ctxt,list);
      }
      if ((((((hasTextDecl != 0) && (xmlDetectEncoding(ctxt), *ctxt->input->cur == '<')) &&
            (ctxt->input->cur[1] == '?')) &&
           ((ctxt->input->cur[2] == 'x' && (ctxt->input->cur[3] == 'm')))) &&
          (ctxt->input->cur[4] == 'l')) &&
         (((ctxt->input->cur[5] == ' ' || ((8 < ctxt->input->cur[5] && (ctxt->input->cur[5] < 0xb)))
           ) || (ctxt->input->cur[5] == '\r')))) {
        xmlParseTextDecl(ctxt);
        iVar1 = xmlStrEqual(ctxt->version,"1.0");
        if ((iVar1 != 0) && (iVar1 = xmlStrEqual(ctxt->input->version,"1.0"), iVar1 == 0)) {
          xmlFatalErrMsg(ctxt,XML_ERR_VERSION_MISMATCH,
                         "Version mismatch between document and entity\n");
        }
      }
      xmlParseContentInternal(ctxt);
      if (ctxt->input->cur < ctxt->input->end) {
        xmlFatalErr(ctxt,XML_ERR_NOT_WELL_BALANCED,(char *)0x0);
      }
      if (((ctxt->wellFormed != 0) ||
          ((ctxt->recovery != 0 && (iVar1 = xmlCtxtIsCatastrophicError(ctxt), iVar1 == 0)))) &&
         (list != (xmlNodePtr)0x0)) {
        rootName = (xmlChar *)list->children;
        list->children = (_xmlNode *)0x0;
        list->last = (_xmlNode *)0x0;
        for (local_48 = (_xmlNode *)rootName; local_48 != (_xmlNode *)0x0; local_48 = local_48->next
            ) {
          local_48->parent = (_xmlNode *)0x0;
        }
      }
      do {
        ctxt->input->cur = ctxt->input->end;
        xmlParserShrink(ctxt);
        iVar1 = xmlParserGrow(ctxt);
      } while (0 < iVar1);
      if (buildTree != 0) {
        nodePop(ctxt);
      }
      namePop(ctxt);
      spacePop(ctxt);
      xmlCtxtPopInput(ctxt);
    }
  }
  else {
    xmlErrMemory(ctxt);
  }
  xmlFreeNode(list);
  return (xmlNodePtr)rootName;
}

Assistant:

static xmlNodePtr
xmlCtxtParseContentInternal(xmlParserCtxtPtr ctxt, xmlParserInputPtr input,
                            int hasTextDecl, int buildTree) {
    xmlNodePtr root = NULL;
    xmlNodePtr list = NULL;
    xmlChar *rootName = BAD_CAST "#root";
    int result;

    if (buildTree) {
        root = xmlNewDocNode(ctxt->myDoc, NULL, rootName, NULL);
        if (root == NULL) {
            xmlErrMemory(ctxt);
            goto error;
        }
    }

    if (xmlCtxtPushInput(ctxt, input) < 0)
        goto error;

    nameNsPush(ctxt, rootName, NULL, NULL, 0, 0);
    spacePush(ctxt, -1);

    if (buildTree)
        nodePush(ctxt, root);

    if (hasTextDecl) {
        xmlDetectEncoding(ctxt);

        /*
         * Parse a possible text declaration first
         */
        if ((CMP5(CUR_PTR, '<', '?', 'x', 'm', 'l')) &&
            (IS_BLANK_CH(NXT(5)))) {
            xmlParseTextDecl(ctxt);
            /*
             * An XML-1.0 document can't reference an entity not XML-1.0
             */
            if ((xmlStrEqual(ctxt->version, BAD_CAST "1.0")) &&
                (!xmlStrEqual(ctxt->input->version, BAD_CAST "1.0"))) {
                xmlFatalErrMsg(ctxt, XML_ERR_VERSION_MISMATCH,
                               "Version mismatch between document and "
                               "entity\n");
            }
        }
    }

    xmlParseContentInternal(ctxt);

    if (ctxt->input->cur < ctxt->input->end)
	xmlFatalErr(ctxt, XML_ERR_NOT_WELL_BALANCED, NULL);

    if ((ctxt->wellFormed) ||
        ((ctxt->recovery) && (!xmlCtxtIsCatastrophicError(ctxt)))) {
        if (root != NULL) {
            xmlNodePtr cur;

            /*
             * Unlink newly created node list.
             */
            list = root->children;
            root->children = NULL;
            root->last = NULL;
            for (cur = list; cur != NULL; cur = cur->next)
                cur->parent = NULL;
        }
    }

    /*
     * Read the rest of the stream in case of errors. We want
     * to account for the whole entity size.
     */
    do {
        ctxt->input->cur = ctxt->input->end;
        xmlParserShrink(ctxt);
        result = xmlParserGrow(ctxt);
    } while (result > 0);

    if (buildTree)
        nodePop(ctxt);

    namePop(ctxt);
    spacePop(ctxt);

    xmlCtxtPopInput(ctxt);

error:
    xmlFreeNode(root);

    return(list);
}